

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void lua_insert(lua_State *L,int idx)

{
  StkId pTVar1;
  TValue *pTVar2;
  int in_ESI;
  lua_State *in_RDI;
  TValue *o1_1;
  TValue *o2_1;
  TValue *o1;
  TValue *o2;
  StkId q;
  StkId p;
  TValue *local_20;
  
  pTVar2 = index2adr(in_RDI,in_ESI);
  for (local_20 = in_RDI->top; pTVar2 < local_20; local_20 = local_20 + -1) {
    local_20->value = local_20[-1].value;
    local_20->tt = local_20[-1].tt;
  }
  pTVar1 = in_RDI->top;
  pTVar2->value = pTVar1->value;
  pTVar2->tt = pTVar1->tt;
  return;
}

Assistant:

static void lua_insert(lua_State*L,int idx){
StkId p;
StkId q;
p=index2adr(L,idx);
api_checkvalidindex(L,p);
for(q=L->top;q>p;q--)setobj(L,q,q-1);
setobj(L,p,L->top);
}